

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::
SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
::SmallVector(SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
              *this,SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
                    *RHS)

{
  U *pUVar1;
  
  pUVar1 = &(this->
            super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
            ).
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_false>
            .
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_void>
            .FirstEl;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX = pUVar1;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX = pUVar1;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.CapacityX = this + 1;
  if ((RHS->
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
      ).
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_void>
      .super_SmallVectorBase.BeginX !=
      (RHS->
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
      ).
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_void>
      .super_SmallVectorBase.EndX) {
    SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
    ::operator=(&this->
                 super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
                ,&RHS->
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
               );
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }